

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

bool __thiscall QNetworkProxyQuery::operator==(QNetworkProxyQuery *this,QNetworkProxyQuery *other)

{
  QNetworkProxyQueryPrivate *pQVar1;
  QNetworkProxyQueryPrivate *pQVar2;
  undefined1 uVar3;
  
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    return true;
  }
  if (((pQVar1 != (QNetworkProxyQueryPrivate *)0x0 && pQVar2 != (QNetworkProxyQueryPrivate *)0x0) &&
      (pQVar2->type == pQVar1->type)) && (pQVar2->localPort == pQVar1->localPort)) {
    uVar3 = comparesEqual(&pQVar2->remote,&pQVar1->remote);
    return (bool)uVar3;
  }
  return false;
}

Assistant:

constexpr P get() const noexcept { return ptr; }